

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStdio.cpp
# Opt level: O0

void __thiscall adios2::transport::FileStdio::CheckFile(FileStdio *this,string *hint)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long in_RDI;
  string errmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  string *in_stack_fffffffffffffe58;
  string *in_stack_fffffffffffffe60;
  string *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  string local_188 [39];
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [39];
  allocator local_61;
  string local_60 [48];
  string local_30 [48];
  
  if (*(long *)(in_RDI + 0xf0) == 0) {
    std::__cxx11::string::string(local_30);
    piVar2 = __errno_location();
    if (*piVar2 != 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      std::__cxx11::string::operator=(local_30,pcVar3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"Toolkit",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,"transport::file::FileStdio",&local_89);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,"CheckFile",&local_b1);
    std::operator+((char *)in_stack_fffffffffffffe58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
    std::operator+(in_stack_fffffffffffffe18,(char *)in_stack_fffffffffffffe10);
    std::operator+(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    helper::Throw<std::ios_base::failure[abi:cxx11]>
              (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
               in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
    std::__cxx11::string::~string(local_d8);
    std::__cxx11::string::~string(local_f8);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_30);
  }
  else {
    iVar1 = ferror(*(FILE **)(in_RDI + 0xf0));
    if (iVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_138,"Toolkit",&local_139);
      paVar4 = &local_161;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_160,"transport::file::FileStdio",paVar4);
      paVar4 = (allocator *)&stack0xfffffffffffffe77;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_188,"CheckFile",paVar4);
      std::operator+((char *)in_stack_fffffffffffffe58,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
      helper::Throw<std::ios_base::failure[abi:cxx11]>
                (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe58,in_stack_fffffffffffffe54);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe50);
      std::__cxx11::string::~string(local_188);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe77);
      std::__cxx11::string::~string(local_160);
      std::allocator<char>::~allocator((allocator<char> *)&local_161);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator((allocator<char> *)&local_139);
    }
  }
  return;
}

Assistant:

void FileStdio::CheckFile(const std::string hint) const
{
    if (!m_File)
    {
        std::string errmsg;
        if (errno)
        {
            errmsg = std::strerror(errno);
        }
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint + ":" + errmsg);
    }
    else if (std::ferror(m_File))
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileStdio", "CheckFile",
                                              "ERROR: " + hint);
    }
}